

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::DeadBranchElimPass::FixPhiNodesInLiveBlocks
          (DeadBranchElimPass *this,Function *func,
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *live_blocks,
          unordered_map<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>_>
          *unreachable_continues)

{
  __uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> block;
  value_type *__x;
  pointer pOVar1;
  IRContext *pIVar2;
  DefUseManager *this_00;
  Instruction **ppIVar3;
  bool bVar4;
  bool bVar5;
  uint32_t uVar6;
  uint uVar7;
  spv_operand_type_t id;
  const_iterator cVar8;
  const_iterator cVar9;
  Instruction *pIVar10;
  Operand *pOVar11;
  Instruction **ppIVar12;
  Instruction *this_01;
  undefined8 extraout_RAX;
  bool bVar13;
  uint32_t uVar14;
  uint32_t before;
  BasicBlock *inc;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  undefined8 local_98;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_90;
  initializer_list<unsigned_int> local_88;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_78;
  uint32_t local_5c;
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_58;
  _Hashtable<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_50;
  pointer local_48;
  pointer local_40;
  Instruction *local_38;
  
  local_40 = (pointer)(func->blocks_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
  local_48 = (pointer)(func->blocks_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
  if (local_40 == local_48) {
    local_98._4_4_ = 0;
  }
  else {
    local_98._4_4_ = 0;
    local_58 = &live_blocks->_M_h;
    local_50 = &unreachable_continues->_M_h;
    do {
      block._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
      .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
           *(tuple<spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_> *)
            local_40;
      local_78.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)block._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                    .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      cVar8 = std::
              _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(local_58,(key_type *)&local_78);
      if (cVar8.super__Node_iterator_base<spvtools::opt::BasicBlock_*,_false>._M_cur !=
          (__node_type *)0x0) {
        this_01 = *(Instruction **)
                   ((long)block._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl +
                   0x20);
        local_38 = (Instruction *)
                   ((long)block._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl +
                   0x18);
        if (this_01 != local_38) {
          do {
            if (this_01->opcode_ != OpPhi) break;
            local_78.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_78.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_78.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            __x = (this_01->operands_).
                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                  ._M_impl.super__Vector_impl_data._M_start;
            if ((this_01->operands_).
                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
                _M_impl.super__Vector_impl_data._M_finish == __x) {
LAB_0054e7c7:
              __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                            ,0x2a0,"Operand &spvtools::opt::Instruction::GetOperand(uint32_t)");
            }
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                      (&local_78,__x);
            pOVar1 = (this_01->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)(((long)(this_01->operands_).
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar1 >> 4) *
                       -0x5555555555555555) < 2) goto LAB_0054e7c7;
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                      (&local_78,pOVar1 + 1);
            uVar7 = (this_01->has_result_id_ & 1) + 1;
            if (this_01->has_type_id_ == false) {
              uVar7 = (uint)this_01->has_result_id_;
            }
            if ((int)((ulong)((long)(this_01->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_01->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
                uVar7 < 2) {
LAB_0054e71e:
              this_01 = (this_01->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
            }
            else {
              uVar14 = 1;
              bVar13 = false;
              bVar5 = false;
              do {
                uVar6 = Instruction::GetSingleWordOperand(this_01,uVar7 + uVar14);
                local_90._M_head_impl = (Instruction *)GetParentBlock(this,uVar6);
                cVar9 = std::
                        _Hashtable<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::find(local_50,(key_type *)&local_90);
                if ((cVar9.
                     super__Node_iterator_base<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_false>
                     ._M_cur == (__node_type *)0x0) ||
                   ((_Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                     )((__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                        *)((long)cVar9.
                                 super__Node_iterator_base<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_false>
                                 ._M_cur + 0x10))->_M_t !=
                    (_Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                     )block._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                      .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)) {
LAB_0054e485:
                  cVar8 = std::
                          _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          ::find(local_58,(key_type *)&local_90);
                  if ((cVar8.super__Node_iterator_base<spvtools::opt::BasicBlock_*,_false>._M_cur !=
                       (__node_type *)0x0) &&
                     (bVar4 = BasicBlock::IsSuccessor
                                        ((BasicBlock *)local_90._M_head_impl,
                                         (BasicBlock *)
                                         block._M_t.
                                         super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                                         .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>.
                                         _M_head_impl), bVar4)) {
                    pOVar11 = Instruction::GetInOperand(this_01,uVar14 - 1);
                    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                    push_back(&local_78,pOVar11);
                    goto LAB_0054e4c4;
                  }
                  bVar13 = true;
                }
                else {
                  uVar7 = (this_01->has_result_id_ & 1) + 1;
                  if (this_01->has_type_id_ == false) {
                    uVar7 = (uint)this_01->has_result_id_;
                  }
                  if ((int)((ulong)((long)(this_01->operands_).
                                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this_01->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                      -0x55555555 - uVar7 < 5) goto LAB_0054e485;
                  pIVar2 = (this->super_MemPass).super_Pass.context_;
                  if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
                    IRContext::BuildDefUseManager(pIVar2);
                    uVar7 = (this_01->has_result_id_ & 1) + 1;
                    if ((this_01->has_type_id_ & 1U) == 0) {
                      uVar7 = (uint)this_01->has_result_id_;
                    }
                  }
                  this_00 = (pIVar2->def_use_mgr_)._M_t.
                            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                            _M_head_impl;
                  uVar6 = Instruction::GetSingleWordOperand(this_01,(uVar14 + uVar7) - 1);
                  pIVar10 = analysis::DefUseManager::GetDef(this_00,uVar6);
                  if (pIVar10->opcode_ == OpUndef) {
                    pOVar11 = Instruction::GetInOperand(this_01,uVar14 - 1);
                    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                    push_back(&local_78,pOVar11);
                    bVar5 = true;
                  }
                  else {
                    local_98._0_4_ = SPV_OPERAND_TYPE_ID;
                    uVar6 = 0;
                    if (this_01->has_type_id_ == true) {
                      uVar6 = Instruction::GetSingleWordOperand(this_01,0);
                    }
                    local_5c = MemPass::Type2Undef(&this->super_MemPass,uVar6);
                    local_88._M_array = &stack0xffffffffffffffa4;
                    local_88._M_len = 1;
                    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
                    emplace_back<spv_operand_type_t,std::initializer_list<unsigned_int>>
                              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>
                                *)&local_78,(spv_operand_type_t *)&local_98,&local_88);
                    bVar5 = true;
                    bVar13 = true;
                  }
LAB_0054e4c4:
                  pOVar11 = Instruction::GetInOperand(this_01,uVar14);
                  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                  push_back(&local_78,pOVar11);
                }
                uVar14 = uVar14 + 2;
                uVar7 = (this_01->has_result_id_ & 1) + 1;
                if (this_01->has_type_id_ == false) {
                  uVar7 = (uint)this_01->has_result_id_;
                }
              } while (uVar14 < (int)((ulong)((long)(this_01->operands_).
                                                                                                        
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)(this_01->operands_).
                                                                                                      
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                                -0x55555555 - uVar7);
              if (!bVar13) goto LAB_0054e71e;
              id = BasicBlock::ContinueBlockIdIfAny
                             ((BasicBlock *)
                              block._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                              .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>.
                              _M_head_impl);
              if (!bVar5 && id != SPV_OPERAND_TYPE_NONE) {
                local_88._M_array = (iterator)GetParentBlock(this,id);
                cVar9 = std::
                        _Hashtable<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::find(local_50,(key_type *)&local_88);
                if ((cVar9.
                     super__Node_iterator_base<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_false>
                     ._M_cur != (__node_type *)0x0) &&
                   (4 < (ulong)(((long)local_78.
                                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_78.
                                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4) *
                               -0x5555555555555555))) {
                  local_90._M_head_impl._0_4_ = 1;
                  uVar14 = 0;
                  if (this_01->has_type_id_ == true) {
                    uVar14 = Instruction::GetSingleWordOperand(this_01,0);
                  }
                  local_98._0_4_ = MemPass::Type2Undef(&this->super_MemPass,uVar14);
                  local_88._M_array = (iterator)&local_98;
                  local_88._M_len = 1;
                  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
                  emplace_back<spv_operand_type_t,std::initializer_list<unsigned_int>>
                            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>
                              *)&local_78,(spv_operand_type_t *)&local_90,&local_88);
                  local_90._M_head_impl._0_4_ = 1;
                  local_88._M_array = (iterator)&local_98;
                  local_88._M_len = 1;
                  local_98._0_4_ = id;
                  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
                  emplace_back<spv_operand_type_t,std::initializer_list<unsigned_int>>
                            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>
                              *)&local_78,(spv_operand_type_t *)&local_90,&local_88);
                }
              }
              if ((long)local_78.
                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_78.
                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                        ._M_impl.super__Vector_impl_data._M_start == 0xc0) {
                ppIVar3 = (Instruction **)
                          (((unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)&(((Instruction *)
                                 ((long)local_78.
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 0x70))->
                                super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_)->
                          _M_t).
                          super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          .
                          super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                          ._M_head_impl;
                ppIVar12 = &(((Instruction *)
                             ((long)local_78.
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 0x70))->
                            super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
                if (ppIVar3 != (Instruction **)0x0) {
                  ppIVar12 = ppIVar3;
                }
                uVar14 = *(uint32_t *)
                          &(*ppIVar12)->super_IntrusiveNodeBase<spvtools::opt::Instruction>;
                pIVar2 = (this->super_MemPass).super_Pass.context_;
                before = 0;
                uVar6 = 0;
                if (this_01->has_result_id_ == true) {
                  uVar6 = Instruction::GetSingleWordOperand(this_01,(uint)this_01->has_type_id_);
                }
                IRContext::KillNamesAndDecorates(pIVar2,uVar6);
                pIVar2 = (this->super_MemPass).super_Pass.context_;
                if (this_01->has_result_id_ == true) {
                  before = Instruction::GetSingleWordOperand(this_01,(uint)this_01->has_type_id_);
                }
                IRContext::ReplaceAllUsesWith(pIVar2,before,uVar14);
                this_01 = IRContext::KillInst((this->super_MemPass).super_Pass.context_,this_01);
                local_98._4_4_ = (undefined4)CONCAT71((int7)((ulong)this_01 >> 8),1);
              }
              else {
                pIVar2 = (this->super_MemPass).super_Pass.context_;
                if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
                  IRContext::BuildDefUseManager(pIVar2);
                }
                analysis::DefUseManager::EraseUseRecordsOfOperandIds
                          ((pIVar2->def_use_mgr_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                           _M_head_impl,this_01);
                Instruction::ReplaceOperands(this_01,(OperandList *)&local_78);
                pIVar2 = (this->super_MemPass).super_Pass.context_;
                if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
                  IRContext::BuildDefUseManager(pIVar2);
                }
                analysis::DefUseManager::AnalyzeInstUse
                          ((pIVar2->def_use_mgr_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                           _M_head_impl,this_01);
                this_01 = (this_01->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
                local_98._4_4_ = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
              }
            }
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                      (&local_78);
          } while (this_01 != local_38);
        }
      }
      local_40 = (pointer)&local_40->words;
    } while (local_40 != local_48);
  }
  return (bool)((byte)local_98._4_4_ & 1);
}

Assistant:

bool DeadBranchElimPass::FixPhiNodesInLiveBlocks(
    Function* func, const std::unordered_set<BasicBlock*>& live_blocks,
    const std::unordered_map<BasicBlock*, BasicBlock*>& unreachable_continues) {
  bool modified = false;
  for (auto& block : *func) {
    if (live_blocks.count(&block)) {
      for (auto iter = block.begin(); iter != block.end();) {
        if (iter->opcode() != spv::Op::OpPhi) {
          break;
        }

        bool changed = false;
        bool backedge_added = false;
        Instruction* inst = &*iter;
        std::vector<Operand> operands;
        // Build a complete set of operands (not just input operands). Start
        // with type and result id operands.
        operands.push_back(inst->GetOperand(0u));
        operands.push_back(inst->GetOperand(1u));
        // Iterate through the incoming labels and determine which to keep
        // and/or modify.  If there in an unreachable continue block, there will
        // be an edge from that block to the header.  We need to keep it to
        // maintain the structured control flow.  If the header has more that 2
        // incoming edges, then the OpPhi must have an entry for that edge.
        // However, if there is only one other incoming edge, the OpPhi can be
        // eliminated.
        for (uint32_t i = 1; i < inst->NumInOperands(); i += 2) {
          BasicBlock* inc = GetParentBlock(inst->GetSingleWordInOperand(i));
          auto cont_iter = unreachable_continues.find(inc);
          if (cont_iter != unreachable_continues.end() &&
              cont_iter->second == &block && inst->NumInOperands() > 4) {
            if (get_def_use_mgr()
                    ->GetDef(inst->GetSingleWordInOperand(i - 1))
                    ->opcode() == spv::Op::OpUndef) {
              // Already undef incoming value, no change necessary.
              operands.push_back(inst->GetInOperand(i - 1));
              operands.push_back(inst->GetInOperand(i));
              backedge_added = true;
            } else {
              // Replace incoming value with undef if this phi exists in the
              // loop header. Otherwise, this edge is not live since the
              // unreachable continue block will be replaced with an
              // unconditional branch to the header only.
              operands.emplace_back(
                  SPV_OPERAND_TYPE_ID,
                  std::initializer_list<uint32_t>{Type2Undef(inst->type_id())});
              operands.push_back(inst->GetInOperand(i));
              changed = true;
              backedge_added = true;
            }
          } else if (live_blocks.count(inc) && inc->IsSuccessor(&block)) {
            // Keep live incoming edge.
            operands.push_back(inst->GetInOperand(i - 1));
            operands.push_back(inst->GetInOperand(i));
          } else {
            // Remove incoming edge.
            changed = true;
          }
        }

        if (changed) {
          modified = true;
          uint32_t continue_id = block.ContinueBlockIdIfAny();
          if (!backedge_added && continue_id != 0 &&
              unreachable_continues.count(GetParentBlock(continue_id)) &&
              operands.size() > 4) {
            // Changed the backedge to branch from the continue block instead
            // of a successor of the continue block. Add an entry to the phi to
            // provide an undef for the continue block. Since the successor of
            // the continue must also be unreachable (dominated by the continue
            // block), any entry for the original backedge has been removed
            // from the phi operands.
            operands.emplace_back(
                SPV_OPERAND_TYPE_ID,
                std::initializer_list<uint32_t>{Type2Undef(inst->type_id())});
            operands.emplace_back(SPV_OPERAND_TYPE_ID,
                                  std::initializer_list<uint32_t>{continue_id});
          }

          // Either replace the phi with a single value or rebuild the phi out
          // of |operands|.
          //
          // We always have type and result id operands. So this phi has a
          // single source if there are two more operands beyond those.
          if (operands.size() == 4) {
            // First input data operands is at index 2.
            uint32_t replId = operands[2u].words[0];
            context()->KillNamesAndDecorates(inst->result_id());
            context()->ReplaceAllUsesWith(inst->result_id(), replId);
            iter = context()->KillInst(&*inst);
          } else {
            // We've rewritten the operands, so first instruct the def/use
            // manager to forget uses in the phi before we replace them. After
            // replacing operands update the def/use manager by re-analyzing
            // the used ids in this phi.
            get_def_use_mgr()->EraseUseRecordsOfOperandIds(inst);
            inst->ReplaceOperands(operands);
            get_def_use_mgr()->AnalyzeInstUse(inst);
            ++iter;
          }
        } else {
          ++iter;
        }
      }
    }
  }

  return modified;
}